

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void ARGBAttenuateRow_AVX2(uint8_t *src_argb,uint8_t *dst_argb,int width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 in_ZMM5 [64];
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_argb_local;
  
  auVar9._16_16_ = (undefined1  [16])libyuv::kShuffleAlpha_AVX2;
  auVar9._0_16_ = (undefined1  [16])libyuv::kShuffleAlpha_AVX2;
  auVar10 = vpcmpeqb_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  auVar10 = vpslld_avx2(auVar10,0x18);
  lVar6 = (long)dst_argb - (long)src_argb;
  do {
    auVar7 = *(undefined1 (*) [32])src_argb;
    auVar8 = vpunpcklbw_avx2(auVar7,auVar7);
    auVar4 = vpunpckhbw_avx2(auVar7,auVar7);
    auVar2 = vpshufb_avx2(auVar8,auVar9);
    auVar3 = vpshufb_avx2(auVar4,auVar9);
    auVar8 = vpmulhuw_avx2(auVar8,auVar2);
    auVar3 = vpmulhuw_avx2(auVar4,auVar3);
    auVar2 = vpand_avx2(auVar7,auVar10);
    auVar7 = vpsrlw_avx2(auVar8,8);
    auVar8 = vpsrlw_avx2(auVar3,8);
    auVar7 = vpackuswb_avx2(auVar7,auVar8);
    auVar7 = vpor_avx2(auVar7,auVar2);
    *(undefined1 (*) [32])((long)src_argb + lVar6) = auVar7;
    src_argb = (uint8_t *)((long)src_argb + 0x20);
    iVar5 = width + -8;
    bVar1 = 7 < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar1);
  return;
}

Assistant:

void ARGBAttenuateRow_AVX2(const uint8_t* src_argb,
                           uint8_t* dst_argb,
                           int width) {
  asm volatile(
      "vbroadcastf128 %3,%%ymm4                  \n"
      "vpcmpeqb    %%ymm5,%%ymm5,%%ymm5          \n"
      "vpslld      $0x18,%%ymm5,%%ymm5           \n"
      "sub         %0,%1                         \n"

      // 8 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm6                   \n"
      "vpunpcklbw  %%ymm6,%%ymm6,%%ymm0          \n"
      "vpunpckhbw  %%ymm6,%%ymm6,%%ymm1          \n"
      "vpshufb     %%ymm4,%%ymm0,%%ymm2          \n"
      "vpshufb     %%ymm4,%%ymm1,%%ymm3          \n"
      "vpmulhuw    %%ymm2,%%ymm0,%%ymm0          \n"
      "vpmulhuw    %%ymm3,%%ymm1,%%ymm1          \n"
      "vpand       %%ymm5,%%ymm6,%%ymm6          \n"
      "vpsrlw      $0x8,%%ymm0,%%ymm0            \n"
      "vpsrlw      $0x8,%%ymm1,%%ymm1            \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"
      "vpor        %%ymm6,%%ymm0,%%ymm0          \n"
      "vmovdqu     %%ymm0,0x00(%0,%1,1)          \n"
      "lea         0x20(%0),%0                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_argb),          // %0
        "+r"(dst_argb),          // %1
        "+r"(width)              // %2
      : "m"(kShuffleAlpha_AVX2)  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6");
}